

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

bool __thiscall ON_LengthValue::Read(ON_LengthValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  AngleUnitSystem AVar2;
  StringFormat SVar3;
  uint local_30;
  uint local_2c;
  uint u;
  uint context_angle_unit_system_as_unsigned;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  int content_version;
  ON_BinaryArchive *archive_local;
  ON_LengthValue *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  context_angle_unit_system_as_unsigned = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk
                    (pOStack_20,(int *)&context_angle_unit_system_as_unsigned);
  if (!bVar1) {
    return false;
  }
  u._3_1_ = 0;
  bVar1 = ON_BinaryArchive::ReadDouble(pOStack_20,&this->m_length);
  if ((bVar1) && (bVar1 = ON_UnitSystem::Read(&this->m_length_unit_system,pOStack_20), bVar1)) {
    local_2c = (uint)this->m_context_angle_unit_system;
    bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_2c);
    if (bVar1) {
      AVar2 = ON::AngleUnitSystemFromUnsigned(local_2c);
      this->m_context_angle_unit_system = AVar2;
      if ((this->m_context_angle_unit_system == None) ||
         (this->m_context_angle_unit_system == Unset)) {
        this->m_context_angle_unit_system = Radians;
      }
      bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&this->m_context_locale_id);
      if ((bVar1) &&
         (bVar1 = ON_BinaryArchive::ReadString(pOStack_20,&this->m_length_as_string), bVar1)) {
        if (0 < (int)context_angle_unit_system_as_unsigned) {
          local_30 = (uint)this->m_string_format;
          bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&local_30);
          if (!bVar1) goto LAB_0085f4ca;
          SVar3 = LengthStringFormatFromUnsigned(local_30);
          this->m_string_format = SVar3;
        }
        u._3_1_ = 1;
      }
    }
  }
LAB_0085f4ca:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(pOStack_20);
  if (!bVar1) {
    u._3_1_ = 0;
  }
  return (bool)(u._3_1_ & 1);
}

Assistant:

bool ON_LengthValue::Read(
  class ON_BinaryArchive& archive
)
{
  *this = ON_LengthValue::Unset;

  int content_version = 0;
  if (!archive.BeginRead3dmAnonymousChunk(&content_version))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!archive.ReadDouble(&m_length))
      break;
    if (!m_length_unit_system.Read(archive))
      break;

    unsigned int context_angle_unit_system_as_unsigned = static_cast<unsigned int>(m_context_angle_unit_system);
    if (!archive.ReadInt(&context_angle_unit_system_as_unsigned))
      break;
    m_context_angle_unit_system = ON::AngleUnitSystemFromUnsigned(context_angle_unit_system_as_unsigned);
    if (ON::AngleUnitSystem::None == m_context_angle_unit_system || ON::AngleUnitSystem::Unset == m_context_angle_unit_system)
      m_context_angle_unit_system = ON::AngleUnitSystem::Radians;
    if (!archive.ReadInt(&m_context_locale_id))
      break;

    if (!archive.ReadString(m_length_as_string))
      break;

    if (content_version >= 1)
    {
      // content version 1 added m_string_format
      unsigned int u = static_cast<unsigned char>(m_string_format);
      if (!archive.ReadInt(&u))
        break;
      m_string_format = ON_LengthValue::LengthStringFormatFromUnsigned(u);
    }

    rc = true;
    break;
  }
  if (!archive.EndRead3dmChunk())
    rc = false;
  return rc;
}